

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O3

uint32_t __thiscall hrgls::datablob::DataBlob::Size(DataBlob *this)

{
  hrgls_DataBlob phVar1;
  hrgls_Status hVar2;
  uint32_t ret;
  uint8_t *data;
  uint32_t local_1c;
  undefined1 local_18 [8];
  
  local_1c = 0;
  phVar1 = this->m_private->blob;
  if (phVar1 == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
    local_1c = 0;
  }
  else {
    hVar2 = hrgls_DataBlobGetData(phVar1,local_18,&local_1c);
    this->m_private->status = hVar2;
  }
  return local_1c;
}

Assistant:

uint32_t DataBlob::Size() const
    {
      uint32_t ret = 0;
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      const uint8_t *data;
      m_private->status = hrgls_DataBlobGetData(m_private->blob, &data, &ret);
      return ret;
    }